

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O0

bool __thiscall
SymbolTable::findEquation(SymbolTable *this,Identifier *name,int file,int section,size_t *dest)

{
  bool bVar1;
  pointer ppVar2;
  bool bVar3;
  _Self local_78 [3];
  _Self local_60;
  iterator it;
  SymbolKey key;
  size_t *dest_local;
  int section_local;
  int file_local;
  Identifier *name_local;
  SymbolTable *this_local;
  
  dest_local._0_4_ = section;
  dest_local._4_4_ = file;
  _section_local = name;
  name_local = (Identifier *)this;
  setFileSectionValues(this,name,(int *)((long)&dest_local + 4),(int *)&dest_local);
  SymbolKey::SymbolKey((SymbolKey *)&it,_section_local,dest_local._4_4_,(int)dest_local);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
       ::find(&this->symbols,(SymbolKey *)&it);
  local_78[0]._M_node =
       (_Base_ptr)
       std::
       map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
       ::end(&this->symbols);
  bVar1 = std::operator==(&local_60,local_78);
  bVar3 = true;
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>::
             operator->(&local_60);
    bVar3 = (ppVar2->second).type != EquationSymbol;
  }
  if (!bVar3) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>::
             operator->(&local_60);
    *dest = (ppVar2->second).index;
  }
  this_local._7_1_ = !bVar3;
  SymbolKey::~SymbolKey((SymbolKey *)&it);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SymbolTable::findEquation(const Identifier& name, int file, int section, size_t& dest)
{
	setFileSectionValues(name,file,section);
	
	SymbolKey key = { name, file, section };
	auto it = symbols.find(key);
	if (it == symbols.end() || it->second.type != EquationSymbol)
		return false;

	dest = it->second.index;
	return true;
}